

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

void __thiscall LogStream::formatInteger<int>(LogStream *this,int v)

{
  int iVar1;
  size_t len_00;
  undefined4 in_ESI;
  FixedBuffer<4000> *in_RDI;
  size_t len;
  undefined8 in_stack_ffffffffffffffe8;
  int value;
  undefined4 in_stack_fffffffffffffff0;
  
  value = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  iVar1 = FixedBuffer<4000>::avail(in_RDI);
  if (0x1f < iVar1) {
    FixedBuffer<4000>::current((FixedBuffer<4000> *)(in_RDI->data_ + 8));
    len_00 = convert<int>((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),value);
    FixedBuffer<4000>::add((FixedBuffer<4000> *)(in_RDI->data_ + 8),len_00);
  }
  return;
}

Assistant:

void LogStream::formatInteger(T v){
    // buffer容不下kMaxNumericSize个字符的话会被直接丢弃 
    if(buffer_.avail() >= kMaxNumericSize){
        size_t len = convert(buffer_.current(), v);
        buffer_.add(len);
    }
}